

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::SetDragDropPayload(char *type,void *data,size_t data_size,ImGuiCond cond)

{
  int *piVar1;
  int iVar2;
  ImGuiContext *pIVar3;
  uchar *puVar4;
  uint uVar5;
  int iVar6;
  uchar *puVar7;
  int iVar8;
  
  pIVar3 = GImGui;
  if ((1 < (uint)cond) && ((GImGui->DragDropPayload).DataFrameCount != -1)) goto LAB_0023baac;
  strncpy((GImGui->DragDropPayload).DataType,type,0x20);
  (pIVar3->DragDropPayload).DataType[0x20] = '\0';
  iVar6 = (pIVar3->DragDropPayloadBufHeap).Capacity;
  if (iVar6 < 0) {
    uVar5 = iVar6 / 2 + iVar6;
    uVar5 = ~((int)uVar5 >> 0x1f) & uVar5;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    puVar4 = (uchar *)(*GImAllocatorAllocFunc)((size_t)uVar5,GImAllocatorUserData);
    puVar7 = (pIVar3->DragDropPayloadBufHeap).Data;
    if (puVar7 != (uchar *)0x0) {
      memcpy(puVar4,puVar7,(long)(pIVar3->DragDropPayloadBufHeap).Size);
      puVar7 = (pIVar3->DragDropPayloadBufHeap).Data;
      if ((puVar7 != (uchar *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar7,GImAllocatorUserData);
    }
    (pIVar3->DragDropPayloadBufHeap).Data = puVar4;
    (pIVar3->DragDropPayloadBufHeap).Capacity = uVar5;
  }
  (pIVar3->DragDropPayloadBufHeap).Size = 0;
  iVar6 = (int)data_size;
  if (data_size < 0x11) {
    if (data_size != 0) {
      puVar7 = pIVar3->DragDropPayloadBufLocal;
      pIVar3->DragDropPayloadBufLocal[0] = '\0';
      pIVar3->DragDropPayloadBufLocal[1] = '\0';
      pIVar3->DragDropPayloadBufLocal[2] = '\0';
      pIVar3->DragDropPayloadBufLocal[3] = '\0';
      pIVar3->DragDropPayloadBufLocal[4] = '\0';
      pIVar3->DragDropPayloadBufLocal[5] = '\0';
      pIVar3->DragDropPayloadBufLocal[6] = '\0';
      pIVar3->DragDropPayloadBufLocal[7] = '\0';
      pIVar3->DragDropPayloadBufLocal[8] = '\0';
      pIVar3->DragDropPayloadBufLocal[9] = '\0';
      pIVar3->DragDropPayloadBufLocal[10] = '\0';
      pIVar3->DragDropPayloadBufLocal[0xb] = '\0';
      pIVar3->DragDropPayloadBufLocal[0xc] = '\0';
      pIVar3->DragDropPayloadBufLocal[0xd] = '\0';
      pIVar3->DragDropPayloadBufLocal[0xe] = '\0';
      pIVar3->DragDropPayloadBufLocal[0xf] = '\0';
      goto LAB_0023ba93;
    }
    (pIVar3->DragDropPayload).Data = (void *)0x0;
  }
  else {
    iVar2 = (pIVar3->DragDropPayloadBufHeap).Capacity;
    if (iVar2 < iVar6) {
      if (iVar2 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar2 / 2 + iVar2;
      }
      if (iVar8 <= iVar6) {
        iVar8 = iVar6;
      }
      if (iVar2 < iVar8) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        puVar4 = (uchar *)(*GImAllocatorAllocFunc)((long)iVar8,GImAllocatorUserData);
        puVar7 = (pIVar3->DragDropPayloadBufHeap).Data;
        if (puVar7 != (uchar *)0x0) {
          memcpy(puVar4,puVar7,(long)(pIVar3->DragDropPayloadBufHeap).Size);
          puVar7 = (pIVar3->DragDropPayloadBufHeap).Data;
          if ((puVar7 != (uchar *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(puVar7,GImAllocatorUserData);
        }
        (pIVar3->DragDropPayloadBufHeap).Data = puVar4;
        (pIVar3->DragDropPayloadBufHeap).Capacity = iVar8;
      }
    }
    (pIVar3->DragDropPayloadBufHeap).Size = iVar6;
    puVar7 = (pIVar3->DragDropPayloadBufHeap).Data;
LAB_0023ba93:
    (pIVar3->DragDropPayload).Data = puVar7;
    memcpy(puVar7,data,data_size);
  }
  (pIVar3->DragDropPayload).DataSize = iVar6;
LAB_0023baac:
  iVar6 = pIVar3->FrameCount;
  (pIVar3->DragDropPayload).DataFrameCount = iVar6;
  return pIVar3->DragDropAcceptFrameCount == iVar6 + -1 || pIVar3->DragDropAcceptFrameCount == iVar6
  ;
}

Assistant:

bool ImGui::SetDragDropPayload(const char* type, const void* data, size_t data_size, ImGuiCond cond)
{
    ImGuiContext& g = *GImGui;
    ImGuiPayload& payload = g.DragDropPayload;
    if (cond == 0)
        cond = ImGuiCond_Always;

    IM_ASSERT(type != NULL);
    IM_ASSERT(strlen(type) < IM_ARRAYSIZE(payload.DataType) && "Payload type can be at most 32 characters long");
    IM_ASSERT((data != NULL && data_size > 0) || (data == NULL && data_size == 0));
    IM_ASSERT(cond == ImGuiCond_Always || cond == ImGuiCond_Once);
    IM_ASSERT(payload.SourceId != 0);                               // Not called between BeginDragDropSource() and EndDragDropSource()

    if (cond == ImGuiCond_Always || payload.DataFrameCount == -1)
    {
        // Copy payload
        ImStrncpy(payload.DataType, type, IM_ARRAYSIZE(payload.DataType));
        g.DragDropPayloadBufHeap.resize(0);
        if (data_size > sizeof(g.DragDropPayloadBufLocal))
        {
            // Store in heap
            g.DragDropPayloadBufHeap.resize((int)data_size);
            payload.Data = g.DragDropPayloadBufHeap.Data;
            memcpy(payload.Data, data, data_size);
        }
        else if (data_size > 0)
        {
            // Store locally
            memset(&g.DragDropPayloadBufLocal, 0, sizeof(g.DragDropPayloadBufLocal));
            payload.Data = g.DragDropPayloadBufLocal;
            memcpy(payload.Data, data, data_size);
        }
        else
        {
            payload.Data = NULL;
        }
        payload.DataSize = (int)data_size;
    }
    payload.DataFrameCount = g.FrameCount;

    return (g.DragDropAcceptFrameCount == g.FrameCount) || (g.DragDropAcceptFrameCount == g.FrameCount - 1);
}